

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall google::protobuf::internal::ExtensionSet::IsInitialized(ExtensionSet *this)

{
  char cVar1;
  CppType CVar2;
  int iVar3;
  Type *pTVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  int i;
  int index;
  
  p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var6; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    CVar2 = anon_unknown_0::cpp_type(*(FieldType *)&p_Var5[1]._M_left);
    if (CVar2 == CPPTYPE_MESSAGE) {
      if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\x01') {
        index = 0;
        while (index < *(int *)&(p_Var5[1]._M_parent)->_M_parent) {
          pTVar4 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)p_Var5[1]._M_parent,index);
          iVar3 = (*pTVar4->_vptr_MessageLite[5])(pTVar4);
          index = index + 1;
          if ((char)iVar3 == '\0') goto LAB_00119ce3;
        }
      }
      else if (((ulong)p_Var5[1]._M_left & 0x10000) == 0) {
        if (((ulong)p_Var5[1]._M_left & 0x100000) == 0) {
          cVar1 = (**(code **)(*(long *)p_Var5[1]._M_parent + 0x28))();
        }
        else {
          cVar1 = (**(code **)(*(long *)p_Var5[1]._M_parent + 0x38))();
        }
        if (cVar1 == '\0') break;
      }
    }
  }
LAB_00119ce3:
  return (_Rb_tree_header *)p_Var5 == p_Var6;
}

Assistant:

bool ExtensionSet::IsInitialized() const {
  // Extensions are never required.  However, we need to check that all
  // embedded messages are initialized.
  for (map<int, Extension>::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    const Extension& extension = iter->second;
    if (cpp_type(extension.type) == WireFormatLite::CPPTYPE_MESSAGE) {
      if (extension.is_repeated) {
        for (int i = 0; i < extension.repeated_message_value->size(); i++) {
          if (!extension.repeated_message_value->Get(i).IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!extension.is_cleared) {
          if (extension.is_lazy) {
            if (!extension.lazymessage_value->IsInitialized()) return false;
          } else {
            if (!extension.message_value->IsInitialized()) return false;
          }
        }
      }
    }
  }

  return true;
}